

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.cc
# Opt level: O0

void brotli::EmitDistance
               (size_t distance,uint8_t *depth,uint16_t *bits,uint32_t *histo,size_t *storage_ix,
               uint8_t *storage)

{
  uint32_t uVar1;
  size_t n;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  size_t distcode;
  size_t offset;
  size_t prefix;
  uint32_t nbits;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  uint32_t *histo_local;
  uint16_t *bits_local;
  uint8_t *depth_local;
  size_t distance_local;
  
  n = distance + 3;
  uVar1 = Log2FloorNonZero(n);
  bVar4 = (byte)(uVar1 - 1);
  uVar2 = n >> (bVar4 & 0x3f) & 1;
  lVar3 = (uVar1 - 2) * 2 + uVar2 + 0x50;
  WriteBits((ulong)depth[lVar3],(ulong)bits[lVar3],storage_ix,storage);
  WriteBits((ulong)(uVar1 - 1),n - (uVar2 + 2 << (bVar4 & 0x3f)),storage_ix,storage);
  histo[lVar3] = histo[lVar3] + 1;
  return;
}

Assistant:

inline void EmitDistance(size_t distance,
                         const uint8_t depth[128],
                         const uint16_t bits[128],
                         uint32_t histo[128],
                         size_t* storage_ix, uint8_t* storage) {
  distance += 3;
  const uint32_t nbits = Log2FloorNonZero(distance) - 1u;
  const size_t prefix = (distance >> nbits) & 1;
  const size_t offset = (2 + prefix) << nbits;
  const size_t distcode = 2 * (nbits - 1) + prefix + 80;
  WriteBits(depth[distcode], bits[distcode], storage_ix, storage);
  WriteBits(nbits, distance - offset, storage_ix, storage);
  ++histo[distcode];
}